

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O2

Function * __thiscall
spv::Builder::makeFunctionEntry
          (Builder *this,Decoration precision,Id returnType,char *name,LinkageType linkType,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *paramTypes,
          vector<std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>,_std::allocator<std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>_>_>
          *decorations,Block **entry)

{
  long lVar1;
  int iVar2;
  Decoration DVar3;
  Builder *this_00;
  Function *pFVar4;
  Block *this_01;
  pointer pvVar5;
  Id IVar6;
  ulong uVar7;
  int d;
  ulong uVar8;
  long lVar9;
  allocator<char> local_79;
  Function *local_78;
  Builder *local_70;
  Id local_64;
  char *local_60;
  ulong local_58;
  string local_50;
  
  local_70 = (Builder *)CONCAT44(local_70._4_4_,linkType);
  local_78 = (Function *)CONCAT44(local_78._4_4_,precision);
  local_60 = name;
  local_64 = makeFunctionType(this,returnType,paramTypes);
  uVar7 = (long)(paramTypes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(paramTypes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                _M_impl.super__Vector_impl_data._M_start;
  if (uVar7 == 0) {
    IVar6 = this->uniqueId;
    uVar8 = 0;
  }
  else {
    uVar8 = (ulong)(this->uniqueId + 1);
    IVar6 = (int)(uVar7 >> 2) + this->uniqueId;
  }
  this->uniqueId = IVar6 + 1;
  pFVar4 = (Function *)::operator_new(0x108);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,local_60,&local_79);
  spv::Function::Function
            (pFVar4,IVar6 + 1,returnType,local_64,(Id)uVar8,(LinkageType)local_70,&local_50,
             &this->module);
  std::__cxx11::string::_M_dispose();
  DVar3 = (Decoration)local_78;
  local_70 = this;
  setPrecision(this,(pFVar4->functionInstruction).resultId,(Decoration)local_78);
  if (DVar3 == DecorationRelaxedPrecision) {
    pFVar4->reducedPrecisionReturn = true;
  }
  pvVar5 = (decorations->
           super__Vector_base<std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>,_std::allocator<std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_78 = pFVar4;
  local_58 = uVar8;
  for (uVar7 = 0; this_00 = local_70, pFVar4 = local_78,
      uVar7 < (((long)(decorations->
                      super__Vector_base<std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>,_std::allocator<std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar5) / 0x18 &
              0xffffffffU); uVar7 = uVar7 + 1) {
    iVar2 = (int)local_58;
    for (lVar9 = 0;
        lVar1 = *(long *)&pvVar5[uVar7].
                          super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>.
                          _M_impl.super__Vector_impl_data,
        lVar9 < (int)((ulong)((long)*(pointer *)
                                     ((long)&pvVar5[uVar7].
                                             super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>
                                             ._M_impl.super__Vector_impl_data + 8) - lVar1) >> 2);
        lVar9 = lVar9 + 1) {
      addDecoration(local_70,iVar2 + (uint)uVar7,*(Decoration *)(lVar1 + lVar9 * 4),-1);
      spv::Function::addParamPrecision
                (local_78,(uint)uVar7,
                 *(Decoration *)
                  (*(long *)&(decorations->
                             super__Vector_base<std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>,_std::allocator<std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start[uVar7].
                             super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>.
                             _M_impl.super__Vector_impl_data + lVar9 * 4));
      pvVar5 = (decorations->
               super__Vector_base<std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>,_std::allocator<std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    }
  }
  if (local_70->emitNonSemanticShaderDebugInfo != false) {
    local_70->dirtyScopeTracker = true;
  }
  if (entry != (Block **)0x0) {
    this_01 = (Block *)::operator_new(0x90);
    IVar6 = this_00->uniqueId + 1;
    this_00->uniqueId = IVar6;
    Block::Block(this_01,IVar6,pFVar4);
    *entry = this_01;
    spv::Function::addBlock(pFVar4,this_01);
    this_00->buildPoint = *entry;
    this_00->dirtyLineTracker = true;
    this_00->dirtyScopeTracker = true;
    if (local_60 != (char *)0x0) {
      addName(this_00,(pFVar4->functionInstruction).resultId,local_60);
    }
    local_50._M_dataplus._M_p = (pointer)pFVar4;
    std::
    vector<std::unique_ptr<spv::Function,std::default_delete<spv::Function>>,std::allocator<std::unique_ptr<spv::Function,std::default_delete<spv::Function>>>>
    ::emplace_back<std::unique_ptr<spv::Function,std::default_delete<spv::Function>>>
              ((vector<std::unique_ptr<spv::Function,std::default_delete<spv::Function>>,std::allocator<std::unique_ptr<spv::Function,std::default_delete<spv::Function>>>>
                *)&this_00->functions,
               (unique_ptr<spv::Function,_std::default_delete<spv::Function>_> *)&local_50);
    if ((Function *)local_50._M_dataplus._M_p != (Function *)0x0) {
      (**(code **)(*(long *)local_50._M_dataplus._M_p + 8))();
    }
    return pFVar4;
  }
  __assert_fail("entry != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                ,0x902,
                "Function *spv::Builder::makeFunctionEntry(Decoration, Id, const char *, LinkageType, const std::vector<Id> &, const std::vector<std::vector<Decoration>> &, Block **)"
               );
}

Assistant:

Function* Builder::makeFunctionEntry(Decoration precision, Id returnType, const char* name, LinkageType linkType,
                                     const std::vector<Id>& paramTypes,
                                     const std::vector<std::vector<Decoration>>& decorations, Block** entry)
{
    // Make the function and initial instructions in it
    Id typeId = makeFunctionType(returnType, paramTypes);
    Id firstParamId = paramTypes.size() == 0 ? 0 : getUniqueIds((int)paramTypes.size());
    Id funcId = getUniqueId();
    Function* function = new Function(funcId, returnType, typeId, firstParamId, linkType, name, module);

    // Set up the precisions
    setPrecision(function->getId(), precision);
    function->setReturnPrecision(precision);
    for (unsigned p = 0; p < (unsigned)decorations.size(); ++p) {
        for (int d = 0; d < (int)decorations[p].size(); ++d) {
            addDecoration(firstParamId + p, decorations[p][d]);
            function->addParamPrecision(p, decorations[p][d]);
        }
    }

    // reset last debug scope
    if (emitNonSemanticShaderDebugInfo) {
        dirtyScopeTracker = true;
    }

    // CFG
    assert(entry != nullptr);
    *entry = new Block(getUniqueId(), *function);
    function->addBlock(*entry);
    setBuildPoint(*entry);

    if (name)
        addName(function->getId(), name);

    functions.push_back(std::unique_ptr<Function>(function));

    return function;
}